

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
alphabet_histogram<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> hist;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  get_histogram<unsigned_long,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,begin,end,0x100);
  mxx::allreduce<unsigned_long,std::plus<unsigned_long>>
            (__return_storage_ptr__,(mxx *)&local_30,comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> alphabet_histogram(InputIterator begin, InputIterator end, const mxx::comm& comm) {
    static_assert(std::is_same<typename std::iterator_traits<InputIterator>::value_type, char>::value, "Iterator must be of value type `char`.");
    // get local histogram of alphabet characters
    std::vector<index_t> hist = get_histogram<index_t>(begin, end, 256);
    std::vector<index_t> out_hist = mxx::allreduce(hist, comm);
    return out_hist;
}